

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

double Extra_Power2(int Degree)

{
  double local_20;
  double Res;
  double dStack_10;
  int Degree_local;
  
  if (-1 < Degree) {
    if (Degree < 0x20) {
      dStack_10 = (double)(1 << ((byte)Degree & 0x1f));
    }
    else {
      local_20 = 1.0;
      for (Res._4_4_ = Degree; Res._4_4_ != 0; Res._4_4_ = Res._4_4_ + -1) {
        local_20 = local_20 * 2.0;
      }
      dStack_10 = local_20;
    }
    return dStack_10;
  }
  __assert_fail("Degree >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilMisc.c"
                ,0x65,"double Extra_Power2(int)");
}

Assistant:

double Extra_Power2( int Degree )
{
    double Res;
    assert( Degree >= 0 );
    if ( Degree < 32 )
        return (double)(01<<Degree); 
    for ( Res = 1.0; Degree; Res *= 2.0, Degree-- );
    return Res;
}